

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O1

uint calculate_next_wait_time(RETRY_CONTROL_INSTANCE *retry_control)

{
  int iVar1;
  uint uVar2;
  LOGGER_LOG p_Var3;
  double dVar4;
  double dVar5;
  
  switch(retry_control->policy) {
  case IOTHUB_CLIENT_RETRY_INTERVAL:
    uVar2 = retry_control->initial_wait_time_in_secs;
    break;
  case IOTHUB_CLIENT_RETRY_LINEAR_BACKOFF:
    uVar2 = retry_control->retry_count * retry_control->initial_wait_time_in_secs;
    if (retry_control->max_delay_in_secs <= uVar2) {
      uVar2 = retry_control->max_delay_in_secs;
    }
    break;
  case IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF:
    dVar4 = exp2((double)(retry_control->retry_count - 1));
    dVar4 = (double)retry_control->initial_wait_time_in_secs * dVar4;
    dVar5 = (double)retry_control->max_delay_in_secs;
    if (dVar4 <= (double)retry_control->max_delay_in_secs) {
      dVar5 = dVar4;
    }
    goto LAB_0014455d;
  case IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF_WITH_JITTER:
    uVar2 = retry_control->max_jitter_percent;
    iVar1 = rand();
    dVar4 = exp2((double)(retry_control->retry_count - 1));
    dVar4 = (double)retry_control->initial_wait_time_in_secs * dVar4;
    dVar5 = (double)retry_control->max_delay_in_secs;
    if (dVar4 <= (double)retry_control->max_delay_in_secs) {
      dVar5 = dVar4;
    }
    dVar5 = (((double)iVar1 / 2147483647.0) * ((double)uVar2 / 100.0) + 1.0) * dVar5;
LAB_0014455d:
    uVar2 = (uint)(long)dVar5;
    break;
  case IOTHUB_CLIENT_RETRY_RANDOM:
    iVar1 = rand();
    uVar2 = (uint)(long)((double)retry_control->initial_wait_time_in_secs *
                        ((double)iVar1 / 2147483647.0));
    break;
  default:
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"calculate_next_wait_time",0xda,1,
                "Failed to calculate the next wait time (policy %d is not expected)",
                retry_control->policy);
    }
  }
  return uVar2;
}

Assistant:

static unsigned int calculate_next_wait_time(RETRY_CONTROL_INSTANCE* retry_control)
{
    unsigned int result;

    if (retry_control->policy == IOTHUB_CLIENT_RETRY_INTERVAL)
    {
        result = retry_control->initial_wait_time_in_secs;
    }
    else if (retry_control->policy == IOTHUB_CLIENT_RETRY_LINEAR_BACKOFF)
    {
        unsigned int base_delay = retry_control->initial_wait_time_in_secs * (retry_control->retry_count);

        if (base_delay > retry_control->max_delay_in_secs) 
        {
            base_delay = retry_control->max_delay_in_secs;
        }        
        
        result = base_delay;
    }
    else if (retry_control->policy == IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF)
    {
        double base_delay = pow(2, retry_control->retry_count - 1) * retry_control->initial_wait_time_in_secs;

        if (base_delay > retry_control->max_delay_in_secs) 
        {
            base_delay = retry_control->max_delay_in_secs;
        }

        result = (unsigned int)base_delay;
    }
    else if (retry_control->policy == IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF_WITH_JITTER)
    {
        double jitter_percent = (retry_control->max_jitter_percent / 100.0) * (rand() / ((double)RAND_MAX));

        double base_delay = pow(2, retry_control->retry_count - 1) * retry_control->initial_wait_time_in_secs;

        if (base_delay > retry_control->max_delay_in_secs) 
        {
            base_delay = retry_control->max_delay_in_secs;
        }

        result =  (unsigned int)(base_delay * (1 + jitter_percent));
    }
    else if (retry_control->policy == IOTHUB_CLIENT_RETRY_RANDOM)
    {
        double random_percent = ((double)rand() / (double)RAND_MAX);
        result = (unsigned int)(retry_control->initial_wait_time_in_secs * random_percent);
    }
    else
    {
        LogError("Failed to calculate the next wait time (policy %d is not expected)", retry_control->policy);

        result = 0;
    }

    return result;
}